

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O1

void __thiscall
btSingleSweepCallback::btSingleSweepCallback
          (btSingleSweepCallback *this,btConvexShape *castShape,btTransform *convexFromTrans,
          btTransform *convexToTrans,btCollisionWorld *world,ConvexResultCallback *resultCallback,
          btScalar allowedPenetration)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  (this->super_btBroadphaseRayCallback).super_btBroadphaseAabbCallback.
  _vptr_btBroadphaseAabbCallback = (_func_int **)&PTR__btBroadphaseAabbCallback_00223c20;
  uVar1 = *(undefined8 *)((convexFromTrans->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_convexFromTrans).m_basis.m_el[0].m_floats =
       *(undefined8 *)(convexFromTrans->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_convexFromTrans).m_basis.m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexFromTrans->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_convexFromTrans).m_basis.m_el[1].m_floats =
       *(undefined8 *)(convexFromTrans->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_convexFromTrans).m_basis.m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexFromTrans->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_convexFromTrans).m_basis.m_el[2].m_floats =
       *(undefined8 *)(convexFromTrans->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_convexFromTrans).m_basis.m_el[2].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexFromTrans->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_convexFromTrans).m_origin.m_floats =
       *(undefined8 *)(convexFromTrans->m_origin).m_floats;
  *(undefined8 *)((this->m_convexFromTrans).m_origin.m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexToTrans->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_convexToTrans).m_basis.m_el[0].m_floats =
       *(undefined8 *)(convexToTrans->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_convexToTrans).m_basis.m_el[0].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexToTrans->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_convexToTrans).m_basis.m_el[1].m_floats =
       *(undefined8 *)(convexToTrans->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_convexToTrans).m_basis.m_el[1].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexToTrans->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_convexToTrans).m_basis.m_el[2].m_floats =
       *(undefined8 *)(convexToTrans->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_convexToTrans).m_basis.m_el[2].m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((convexToTrans->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_convexToTrans).m_origin.m_floats =
       *(undefined8 *)(convexToTrans->m_origin).m_floats;
  *(undefined8 *)((this->m_convexToTrans).m_origin.m_floats + 2) = uVar1;
  this->m_world = world;
  this->m_resultCallback = resultCallback;
  this->m_allowedCcdPenetration = allowedPenetration;
  this->m_castShape = castShape;
  fVar10 = (this->m_convexToTrans).m_origin.m_floats[2] -
           (this->m_convexFromTrans).m_origin.m_floats[2];
  uVar1 = *(undefined8 *)(this->m_convexFromTrans).m_origin.m_floats;
  uVar2 = *(undefined8 *)(this->m_convexToTrans).m_origin.m_floats;
  fVar11 = (float)uVar2 - (float)uVar1;
  fVar12 = (float)((ulong)uVar2 >> 0x20) - (float)((ulong)uVar1 >> 0x20);
  fVar3 = fVar10 * fVar10 + fVar11 * fVar11 + fVar12 * fVar12;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar3 = 1.0 / fVar3;
  fVar4 = fVar10 * fVar3;
  fVar5 = fVar3 * fVar11;
  fVar6 = fVar3 * fVar12;
  auVar8._4_4_ = fVar6;
  auVar8._0_4_ = fVar5;
  auVar8._8_4_ = fVar3 * 0.0;
  auVar8._12_4_ = fVar3 * 0.0;
  auVar8 = divps(_DAT_001f53f0,auVar8);
  fVar3 = (float)(-(uint)(fVar5 == 0.0) & 0x5d5e0b6b | ~-(uint)(fVar5 == 0.0) & auVar8._0_4_);
  fVar7 = (float)(-(uint)(fVar6 == 0.0) & 0x5d5e0b6b | ~-(uint)(fVar6 == 0.0) & auVar8._4_4_);
  (this->super_btBroadphaseRayCallback).m_rayDirectionInverse.m_floats[0] = fVar3;
  (this->super_btBroadphaseRayCallback).m_rayDirectionInverse.m_floats[1] = fVar7;
  fVar9 = (float)(-(uint)(fVar4 == 0.0) & 0x5d5e0b6b | ~-(uint)(fVar4 == 0.0) & (uint)(1.0 / fVar4))
  ;
  (this->super_btBroadphaseRayCallback).m_rayDirectionInverse.m_floats[2] = fVar9;
  *(ulong *)(this->super_btBroadphaseRayCallback).m_signs =
       CONCAT44(-(uint)(fVar7 < 0.0),-(uint)(fVar3 < 0.0)) & 0x100000001;
  (this->super_btBroadphaseRayCallback).m_signs[2] = (uint)(fVar9 < 0.0);
  (this->super_btBroadphaseRayCallback).m_lambda_max =
       fVar4 * fVar10 + fVar5 * fVar11 + fVar12 * fVar6;
  return;
}

Assistant:

btSingleSweepCallback(const btConvexShape* castShape, const btTransform& convexFromTrans,const btTransform& convexToTrans,const btCollisionWorld* world,btCollisionWorld::ConvexResultCallback& resultCallback,btScalar allowedPenetration)
		:m_convexFromTrans(convexFromTrans),
		m_convexToTrans(convexToTrans),
		m_world(world),
		m_resultCallback(resultCallback),
		m_allowedCcdPenetration(allowedPenetration),
		m_castShape(castShape)
	{
		btVector3 unnormalizedRayDir = (m_convexToTrans.getOrigin()-m_convexFromTrans.getOrigin());
		btVector3 rayDir = unnormalizedRayDir.normalized();
		///what about division by zero? --> just set rayDirection[i] to INF/BT_LARGE_FLOAT
		m_rayDirectionInverse[0] = rayDir[0] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[0];
		m_rayDirectionInverse[1] = rayDir[1] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[1];
		m_rayDirectionInverse[2] = rayDir[2] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[2];
		m_signs[0] = m_rayDirectionInverse[0] < 0.0;
		m_signs[1] = m_rayDirectionInverse[1] < 0.0;
		m_signs[2] = m_rayDirectionInverse[2] < 0.0;

		m_lambda_max = rayDir.dot(unnormalizedRayDir);

	}